

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int ccm_auth_crypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                  uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  size_t local_50;
  size_t olen;
  uchar *puStack_40;
  int ret;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t length_local;
  mbedtls_ccm_context *pmStack_18;
  int mode_local;
  mbedtls_ccm_context *ctx_local;
  
  olen._4_4_ = 0xffffff92;
  puStack_40 = add;
  add_local = (uchar *)iv_len;
  iv_len_local = (size_t)iv;
  iv_local = (uchar *)length;
  length_local._4_4_ = mode;
  pmStack_18 = ctx;
  olen._4_4_ = mbedtls_ccm_starts(ctx,mode,iv,iv_len);
  ctx_local._4_4_ = olen._4_4_;
  if ((((olen._4_4_ == 0) &&
       (olen._4_4_ = mbedtls_ccm_set_lengths(pmStack_18,add_len,(size_t)iv_local,tag_len),
       ctx_local._4_4_ = olen._4_4_, olen._4_4_ == 0)) &&
      (olen._4_4_ = mbedtls_ccm_update_ad(pmStack_18,puStack_40,add_len),
      ctx_local._4_4_ = olen._4_4_, olen._4_4_ == 0)) &&
     ((olen._4_4_ = mbedtls_ccm_update(pmStack_18,input,(size_t)iv_local,output,(size_t)iv_local,
                                       &local_50), ctx_local._4_4_ = olen._4_4_, olen._4_4_ == 0 &&
      (ctx_local._4_4_ = mbedtls_ccm_finish(pmStack_18,tag,tag_len), ctx_local._4_4_ == 0)))) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int ccm_auth_crypt(mbedtls_ccm_context *ctx, int mode, size_t length,
                          const unsigned char *iv, size_t iv_len,
                          const unsigned char *add, size_t add_len,
                          const unsigned char *input, unsigned char *output,
                          unsigned char *tag, size_t tag_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen;

    if ((ret = mbedtls_ccm_starts(ctx, mode, iv, iv_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_set_lengths(ctx, add_len, length, tag_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_update_ad(ctx, add, add_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_update(ctx, input, length,
                                  output, length, &olen)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_finish(ctx, tag, tag_len)) != 0) {
        return ret;
    }

    return 0;
}